

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O0

bool __thiscall
SuperCardPro::SetParameters
          (SuperCardPro *this,int drive_select_delay_us,int step_delay_us,int motor_on_delay_ms,
          int seek_0_delay_ms,int motor_off_delay_ms)

{
  bool bVar1;
  unsigned_short local_2e;
  unsigned_short local_2c;
  unsigned_short local_2a;
  unsigned_short local_28;
  uint16_t params [5];
  int motor_off_delay_ms_local;
  int seek_0_delay_ms_local;
  int motor_on_delay_ms_local;
  int step_delay_us_local;
  int drive_select_delay_us_local;
  SuperCardPro *this_local;
  
  params._2_4_ = motor_off_delay_ms;
  params._6_4_ = seek_0_delay_ms;
  memset(&local_2e,0,10);
  local_2e = util::betoh<unsigned_short>((unsigned_short)drive_select_delay_us);
  local_2c = util::betoh<unsigned_short>((unsigned_short)step_delay_us);
  local_2a = util::betoh<unsigned_short>((unsigned_short)motor_on_delay_ms);
  local_28 = util::betoh<unsigned_short>((unsigned_short)params._6_4_);
  params[0] = util::betoh<unsigned_short>((unsigned_short)params._2_4_);
  bVar1 = SendCmd(this,0x91,&local_2e,10,(void *)0x0,0);
  return bVar1;
}

Assistant:

bool SuperCardPro::SetParameters(int drive_select_delay_us, int step_delay_us, int motor_on_delay_ms, int seek_0_delay_ms, int motor_off_delay_ms)
{
    uint16_t params[5] = {};

    params[0] = util::betoh(static_cast<uint16_t>(drive_select_delay_us));
    params[1] = util::betoh(static_cast<uint16_t>(step_delay_us));
    params[2] = util::betoh(static_cast<uint16_t>(motor_on_delay_ms));
    params[3] = util::betoh(static_cast<uint16_t>(seek_0_delay_ms));
    params[4] = util::betoh(static_cast<uint16_t>(motor_off_delay_ms));

    return SendCmd(CMD_SETPARAMS, params, sizeof(params));
}